

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.h
# Opt level: O3

void __thiscall
soplex::SPxMainSM<double>::ForceConstraintPS::ForceConstraintPS
          (ForceConstraintPS *this,ForceConstraintPS *old)

{
  double dVar1;
  int iVar2;
  
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__PostStep_003afb68;
  (this->super_PostStep).m_name = (old->super_PostStep).m_name;
  iVar2 = (old->super_PostStep).nRows;
  (this->super_PostStep).nCols = (old->super_PostStep).nCols;
  (this->super_PostStep).nRows = iVar2;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_PostStep)._tolerances.
  super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (old->super_PostStep)._tolerances.
       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             &(old->super_PostStep)._tolerances.
              super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  (this->super_PostStep)._vptr_PostStep = (_func_int **)&PTR__ForceConstraintPS_003aff10;
  iVar2 = old->m_old_i;
  this->m_i = old->m_i;
  this->m_old_i = iVar2;
  this->m_lRhs = old->m_lRhs;
  DSVectorBase<double>::DSVectorBase(&this->m_row,&old->m_row);
  Array<double>::Array(&this->m_objs,&old->m_objs);
  DataArray<bool>::DataArray(&this->m_fixed,&old->m_fixed);
  Array<soplex::DSVectorBase<double>_>::Array(&this->m_cols,&old->m_cols);
  this->m_lhsFixed = old->m_lhsFixed;
  this->m_maxSense = old->m_maxSense;
  Array<double>::Array(&this->m_oldLowers,&old->m_oldLowers);
  Array<double>::Array(&this->m_oldUppers,&old->m_oldUppers);
  dVar1 = old->m_rhs;
  this->m_lhs = old->m_lhs;
  this->m_rhs = dVar1;
  this->m_rowobj = old->m_rowobj;
  return;
}

Assistant:

ForceConstraintPS(const ForceConstraintPS& old)
         : PostStep(old)
         , m_i(old.m_i)
         , m_old_i(old.m_old_i)
         , m_lRhs(old.m_lRhs)
         , m_row(old.m_row)
         , m_objs(old.m_objs)
         , m_fixed(old.m_fixed)
         , m_cols(old.m_cols)
         , m_lhsFixed(old.m_lhsFixed)
         , m_maxSense(old.m_maxSense)
         , m_oldLowers(old.m_oldLowers)
         , m_oldUppers(old.m_oldUppers)
         , m_lhs(old.m_lhs)
         , m_rhs(old.m_rhs)
         , m_rowobj(old.m_rowobj)
      {}